

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O2

void duckdb::ArgMinMaxBase<duckdb::LessThan,false>::
     Assign<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::ArgMinMaxState<duckdb::hugeint_t,duckdb::hugeint_t>>
               (ArgMinMaxState<duckdb::hugeint_t,_duckdb::hugeint_t> *state,hugeint_t *x,
               hugeint_t *y,bool x_null)

{
  int64_t iVar1;
  undefined3 in_register_00000009;
  
  (state->super_ArgMinMaxStateBase).arg_null = x_null;
  if (CONCAT31(in_register_00000009,x_null) == 0) {
    iVar1 = x->upper;
    (state->arg).lower = x->lower;
    (state->arg).upper = iVar1;
  }
  iVar1 = y->upper;
  (state->value).lower = y->lower;
  (state->value).upper = iVar1;
  return;
}

Assistant:

static void Assign(STATE &state, const A_TYPE &x, const B_TYPE &y, const bool x_null) {
		if (IGNORE_NULL) {
			STATE::template AssignValue<A_TYPE>(state.arg, x);
			STATE::template AssignValue<B_TYPE>(state.value, y);
		} else {
			state.arg_null = x_null;
			if (!state.arg_null) {
				STATE::template AssignValue<A_TYPE>(state.arg, x);
			}
			STATE::template AssignValue<B_TYPE>(state.value, y);
		}
	}